

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::UpdateJoystickState(CInput *this)

{
  int iVar1;
  long *plVar2;
  long *in_RDI;
  float fVar3;
  float fVar4;
  int Key;
  int HatState;
  int Hat;
  int RightKey;
  int LeftKey;
  float Value;
  int Axis;
  float DeadZone;
  IJoystick *pJoystick;
  int local_30;
  int local_28;
  int local_18;
  
  plVar2 = (long *)(**(code **)(*in_RDI + 0x38))();
  if (plVar2 != (long *)0x0) {
    fVar3 = GetJoystickDeadzone((CInput *)0x133919);
    for (local_18 = 0; iVar1 = (**(code **)(*plVar2 + 0x10))(), local_18 < iVar1;
        local_18 = local_18 + 1) {
      fVar4 = (float)(**(code **)(*plVar2 + 0x30))(plVar2,local_18);
      *(bool *)((long)in_RDI + (long)(local_18 * 2 + 0x1c2) + 0x1aa0) = fVar4 <= -fVar3;
      *(bool *)((long)in_RDI + (long)(local_18 * 2 + 0x1c3) + 0x1aa0) = fVar3 <= fVar4;
    }
    for (local_28 = 0; iVar1 = (**(code **)(*plVar2 + 0x28))(), local_28 < iVar1;
        local_28 = local_28 + 1) {
      iVar1 = (**(code **)(*plVar2 + 0x38))(plVar2,local_28);
      for (local_30 = local_28 * 8 + 0x1b2; local_30 <= local_28 * 8 + 0x1b9;
          local_30 = local_30 + 1) {
        *(bool *)((long)in_RDI + (long)local_30 + 0x1aa0) = local_30 == iVar1;
      }
    }
  }
  return;
}

Assistant:

void CInput::UpdateJoystickState()
{
	IJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick)
		return;

	const float DeadZone = GetJoystickDeadzone();
	for(int Axis = 0; Axis < pJoystick->GetNumAxes(); Axis++)
	{
		const float Value = pJoystick->GetAxisValue(Axis);
		const int LeftKey = KEY_JOY_AXIS_0_LEFT + 2 * Axis;
		const int RightKey = LeftKey + 1;
		m_aInputState[LeftKey] = Value <= -DeadZone;
		m_aInputState[RightKey] = Value >= DeadZone;
	}

	for(int Hat = 0; Hat < pJoystick->GetNumHats(); Hat++)
	{
		const int HatState = pJoystick->GetHatValue(Hat);
		for(int Key = KEY_JOY_HAT0_LEFTUP + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
			m_aInputState[Key] = Key == HatState;
	}
}